

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimeComparison.cxx
# Opt level: O3

bool __thiscall
cmFileTimeComparisonInternal::FileTimesDiffer(cmFileTimeComparisonInternal *this,char *f1,char *f2)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  stat s2;
  stat s1;
  stat sStack_138;
  stat local_a8;
  
  bVar1 = Stat(this,f1,&local_a8);
  bVar5 = true;
  if ((bVar1) && (bVar1 = Stat(this,f2,&sStack_138), bVar1)) {
    lVar2 = local_a8.st_mtim.tv_sec * 1000000000 + local_a8.st_mtim.tv_nsec;
    lVar3 = sStack_138.st_mtim.tv_sec * 1000000000 + sStack_138.st_mtim.tv_nsec;
    lVar4 = lVar2 - lVar3;
    if (lVar2 < lVar3) {
      lVar4 = lVar3 - lVar2;
    }
    else if (lVar4 == 0 || lVar2 < lVar3) {
      return false;
    }
    bVar5 = 999999999 < lVar4;
  }
  return bVar5;
}

Assistant:

bool cmFileTimeComparisonInternal::FileTimesDiffer(const char* f1,
                                                   const char* f2)
{
  // Get the modification time for each file.
  cmFileTimeComparison_Type s1;
  cmFileTimeComparison_Type s2;
  if (this->Stat(f1, &s1) && this->Stat(f2, &s2)) {
    // Compare the two modification times.
    return this->TimesDiffer(&s1, &s2);
  }
  // No comparison available.  Default to different times.
  return true;
}